

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

long __thiscall DeviceTy::getMapEntryRefCnt(DeviceTy *this,void *HstPtrBegin)

{
  int iVar1;
  _List_node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->DataMapMtx);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  p_Var2 = (_List_node_base *)&this->HostDataToTargetMap;
  do {
    p_Var2 = (((_List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_> *)
              &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->HostDataToTargetMap) {
      p_Var2 = (_List_node_base *)0xffffffffffffffff;
      goto LAB_00102cf0;
    }
  } while ((HstPtrBegin < p_Var2[1]._M_prev) || (p_Var2[2]._M_next <= HstPtrBegin));
  p_Var2 = p_Var2[3]._M_next;
LAB_00102cf0:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return (long)p_Var2;
}

Assistant:

long DeviceTy::getMapEntryRefCnt(void *HstPtrBegin) {
  uintptr_t hp = (uintptr_t)HstPtrBegin;
  long RefCnt = -1;

  DataMapMtx.lock();
  for (auto &HT : HostDataToTargetMap) {
    if (hp >= HT.HstPtrBegin && hp < HT.HstPtrEnd) {
      DP("DeviceTy::getMapEntry: requested entry found\n");
      RefCnt = HT.RefCount;
      break;
    }
  }
  DataMapMtx.unlock();

  if (RefCnt < 0) {
    DP("DeviceTy::getMapEntry: requested entry not found\n");
  }

  return RefCnt;
}